

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotHeatmap<unsigned_short>
               (char *label_id,unsigned_short *values,int rows,int cols,double scale_min,
               double scale_max,char *fmt,ImPlotPoint *bounds_min,ImPlotPoint *bounds_max)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  TransformerLinLin transformer;
  ImPlotPlot *pIVar5;
  ImPlotContext *pIVar6;
  bool bVar7;
  ImDrawList *DrawList;
  ImPlotRange *pIVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  bVar7 = BeginItem(label_id,-1);
  pIVar6 = GImPlot;
  if (!bVar7) {
    return;
  }
  if (GImPlot->FitThisFrame != true) goto LAB_00231d21;
  pIVar5 = GImPlot->CurrentPlot;
  iVar2 = pIVar5->CurrentYAxis;
  dVar10 = bounds_min->x;
  dVar9 = bounds_min->y;
  uVar3 = (pIVar5->XAxis).Flags;
  if ((uVar3 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar10) < 0x7ff0000000000000) {
LAB_00231ba0:
      if ((0.0 < dVar10) || ((uVar3 & 0x20) == 0)) {
        dVar1 = (GImPlot->ExtentsX).Min;
        dVar11 = dVar10;
        if (dVar1 <= dVar10) {
          dVar11 = dVar1;
        }
        (GImPlot->ExtentsX).Min = dVar11;
        dVar1 = (pIVar6->ExtentsX).Max;
        dVar11 = dVar10;
        if (dVar10 <= dVar1) {
          dVar11 = dVar1;
        }
        (pIVar6->ExtentsX).Max = dVar11;
      }
    }
  }
  else if ((((ulong)ABS(dVar10) < 0x7ff0000000000000) && (pIVar5->YAxis[iVar2].Range.Min <= dVar9))
          && (dVar9 <= pIVar5->YAxis[iVar2].Range.Max)) goto LAB_00231ba0;
  pIVar8 = pIVar6->ExtentsY + iVar2;
  uVar4 = pIVar5->YAxis[iVar2].Flags;
  if ((uVar4 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
LAB_00231c1b:
      if ((0.0 < dVar9) || ((uVar4 & 0x20) == 0)) {
        dVar10 = dVar9;
        if (pIVar8->Min <= dVar9) {
          dVar10 = pIVar8->Min;
        }
        pIVar8->Min = dVar10;
        dVar10 = pIVar6->ExtentsY[iVar2].Max;
        if (dVar9 <= dVar10) {
          dVar9 = dVar10;
        }
        pIVar6->ExtentsY[iVar2].Max = dVar9;
      }
    }
  }
  else if ((((ulong)ABS(dVar9) < 0x7ff0000000000000) && ((pIVar5->XAxis).Range.Min <= dVar10)) &&
          (dVar10 <= (pIVar5->XAxis).Range.Max)) goto LAB_00231c1b;
  dVar10 = bounds_max->x;
  dVar9 = bounds_max->y;
  if ((uVar3 >> 10 & 1) == 0) {
    if ((ulong)ABS(dVar10) < 0x7ff0000000000000) {
LAB_00231c8a:
      if (((uVar3 & 0x20) == 0) || (0.0 < dVar10)) {
        dVar1 = (pIVar6->ExtentsX).Min;
        dVar11 = dVar10;
        if (dVar1 <= dVar10) {
          dVar11 = dVar1;
        }
        (pIVar6->ExtentsX).Min = dVar11;
        dVar1 = (pIVar6->ExtentsX).Max;
        dVar11 = dVar10;
        if (dVar10 <= dVar1) {
          dVar11 = dVar1;
        }
        (pIVar6->ExtentsX).Max = dVar11;
      }
    }
  }
  else if ((((ulong)ABS(dVar10) < 0x7ff0000000000000) && (pIVar5->YAxis[iVar2].Range.Min <= dVar9))
          && (dVar9 <= pIVar5->YAxis[iVar2].Range.Max)) goto LAB_00231c8a;
  if ((uVar4 >> 10 & 1) == 0) {
    if (0x7fefffffffffffff < (ulong)ABS(dVar9)) goto LAB_00231d21;
  }
  else if (((0x7fefffffffffffff < (ulong)ABS(dVar9)) || (dVar10 < (pIVar5->XAxis).Range.Min)) ||
          ((pIVar5->XAxis).Range.Max < dVar10)) goto LAB_00231d21;
  if (((uVar4 & 0x20) == 0) || (0.0 < dVar9)) {
    dVar10 = dVar9;
    if (pIVar8->Min <= dVar9) {
      dVar10 = pIVar8->Min;
    }
    pIVar8->Min = dVar10;
    dVar10 = pIVar6->ExtentsY[iVar2].Max;
    if (dVar9 <= dVar10) {
      dVar9 = dVar10;
    }
    pIVar6->ExtentsY[iVar2].Max = dVar9;
  }
LAB_00231d21:
  DrawList = GetPlotDrawList();
  transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
  switch(GImPlot->Scales[transformer.YAxis]) {
  case 0:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLinLin>
              (transformer,DrawList,values,rows,cols,scale_min,scale_max,fmt,bounds_min,bounds_max,
               true);
    break;
  case 1:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLogLin>
              ((TransformerLogLin)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
    break;
  case 2:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLinLog>
              ((TransformerLinLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
    break;
  case 3:
    RenderHeatmap<unsigned_short,ImPlot::TransformerLogLog>
              ((TransformerLogLog)transformer.YAxis,DrawList,values,rows,cols,scale_min,scale_max,
               fmt,bounds_min,bounds_max,true);
  }
  pIVar6 = GImPlot;
  PopPlotClipRect();
  ImPlotNextItemData::Reset(&pIVar6->NextItemData);
  pIVar6->PreviousItem = pIVar6->CurrentItem;
  pIVar6->CurrentItem = (ImPlotItem *)0x0;
  return;
}

Assistant:

void PlotHeatmap(const char* label_id, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(bounds_min);
            FitPoint(bounds_max);
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, values, rows, cols, scale_min, scale_max, fmt, bounds_min, bounds_max, true); break;
        }
        EndItem();
    }
}